

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O1

void mi_page_queue_enqueue_from_ex
               (mi_page_queue_t *to,mi_page_queue_t *from,_Bool enqueue_at_end,mi_page_t *page)

{
  long lVar1;
  mi_page_s *pmVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  undefined7 in_register_00000011;
  mi_page_queue_t *pmVar7;
  mi_page_t *pmVar8;
  mi_page_t *pmVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  lVar1 = *(long *)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x40);
  pmVar2 = *(mi_page_s **)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x50);
  if (pmVar2 != (mi_page_s *)0x0) {
    pmVar2->next = *(mi_page_s **)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x48);
  }
  pmVar8 = *(mi_page_t **)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x48);
  if (pmVar8 != (mi_page_t *)0x0) {
    pmVar8->prev = pmVar2;
  }
  if (from->last == (mi_page_t *)CONCAT71(in_register_00000011,enqueue_at_end)) {
    from->last = *(mi_page_t **)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x50);
  }
  if (from->first == (mi_page_t *)CONCAT71(in_register_00000011,enqueue_at_end)) {
    from->first = pmVar8;
    auVar5 = _DAT_00548b70;
    auVar4 = _DAT_00500510;
    uVar13 = from->block_size;
    if (uVar13 < 0x401) {
      pmVar9 = &_mi_page_empty;
      if (pmVar8 != (mi_page_t *)0x0) {
        pmVar9 = pmVar8;
      }
      if (*(mi_page_t **)(lVar1 + 0xf8 + (uVar13 + 7 & 0xfffffffffffffff8)) != pmVar9) {
        uVar11 = uVar13 + 7 >> 3;
        if (uVar13 < 9) {
          uVar13 = 0;
        }
        else {
          if (uVar13 < 0x41) {
            uVar13 = (ulong)((int)uVar11 + 1U & 0x1e);
          }
          else {
            uVar13 = uVar11 - 1;
            uVar14 = 0x3f;
            if (uVar13 != 0) {
              for (; uVar13 >> uVar14 == 0; uVar14 = uVar14 - 1) {
              }
            }
            uVar13 = ((ulong)((uint)(uVar13 >> (0x3dU - (char)(uVar14 ^ 0x3f) & 0x3f)) & 3) +
                      ((uVar14 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
          }
          pmVar7 = from + -1;
          do {
            uVar15 = pmVar7->block_size + 7;
            uVar14 = uVar15 >> 3;
            if (uVar15 < 0x48) {
              uVar6 = (ulong)((int)uVar14 + 1U & 0x1e);
              if (uVar15 < 0x10) {
                uVar6 = 1;
              }
            }
            else if (uVar15 < 0x10008) {
              uVar15 = uVar14 - 1;
              uVar6 = 0x3f;
              if (uVar15 != 0) {
                for (; uVar15 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              uVar6 = ((ulong)((uint)(uVar15 >> (0x3dU - (char)(uVar6 ^ 0x3f) & 0x3f)) & 3) +
                       ((uVar6 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
            }
            else {
              uVar6 = 0x49;
            }
          } while ((uVar13 == uVar6) &&
                  (bVar3 = (mi_page_queue_t *)(lVar1 + 0x500U) < pmVar7, pmVar7 = pmVar7 + -1, bVar3
                  ));
          uVar13 = uVar14 + 1;
          if (uVar11 <= uVar14) {
            uVar13 = uVar11;
          }
        }
        if (uVar13 <= uVar11) {
          lVar12 = uVar11 - uVar13;
          auVar16._8_4_ = (int)lVar12;
          auVar16._0_8_ = lVar12;
          auVar16._12_4_ = (int)((ulong)lVar12 >> 0x20);
          lVar10 = lVar1 + uVar13 * 8;
          uVar13 = 0;
          auVar16 = auVar16 ^ _DAT_00500510;
          do {
            auVar18._8_4_ = (int)uVar13;
            auVar18._0_8_ = uVar13;
            auVar18._12_4_ = (int)(uVar13 >> 0x20);
            auVar18 = (auVar18 | auVar5) ^ auVar4;
            if ((bool)(~(auVar18._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar18._0_4_ ||
                        auVar16._4_4_ < auVar18._4_4_) & 1)) {
              *(mi_page_t **)(lVar10 + 0xf8 + uVar13 * 8) = pmVar9;
            }
            if ((auVar18._12_4_ != auVar16._12_4_ || auVar18._8_4_ <= auVar16._8_4_) &&
                auVar18._12_4_ <= auVar16._12_4_) {
              *(mi_page_t **)(lVar10 + 0x100 + uVar13 * 8) = pmVar9;
            }
            uVar13 = uVar13 + 2;
          } while ((lVar12 + 2U & 0xfffffffffffffffe) != uVar13);
        }
      }
    }
  }
  pmVar8 = to->last;
  *(mi_page_t **)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x50) = pmVar8;
  *(undefined8 *)(CONCAT71(in_register_00000011,enqueue_at_end) + 0x48) = 0;
  if (pmVar8 == (mi_page_t *)0x0) {
    to->first = (mi_page_t *)CONCAT71(in_register_00000011,enqueue_at_end);
    to->last = (mi_page_t *)CONCAT71(in_register_00000011,enqueue_at_end);
    auVar5 = _DAT_00548b70;
    auVar4 = _DAT_00500510;
    uVar13 = to->block_size;
    if (uVar13 < 0x401) {
      pmVar8 = &_mi_page_empty;
      if (CONCAT71(in_register_00000011,enqueue_at_end) != 0) {
        pmVar8 = (mi_page_t *)CONCAT71(in_register_00000011,enqueue_at_end);
      }
      if (*(mi_page_t **)(lVar1 + 0xf8 + (uVar13 + 7 & 0xfffffffffffffff8)) != pmVar8) {
        uVar11 = uVar13 + 7 >> 3;
        if (uVar13 < 9) {
          uVar13 = 0;
        }
        else {
          if (uVar13 < 0x41) {
            uVar13 = (ulong)((int)uVar11 + 1U & 0x1e);
          }
          else {
            uVar13 = uVar11 - 1;
            uVar14 = 0x3f;
            if (uVar13 != 0) {
              for (; uVar13 >> uVar14 == 0; uVar14 = uVar14 - 1) {
              }
            }
            uVar13 = ((ulong)((uint)(uVar13 >> (0x3dU - (char)(uVar14 ^ 0x3f) & 0x3f)) & 3) +
                      ((uVar14 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
          }
          pmVar7 = to + -1;
          do {
            uVar15 = pmVar7->block_size + 7;
            uVar14 = uVar15 >> 3;
            if (uVar15 < 0x48) {
              uVar6 = (ulong)((int)uVar14 + 1U & 0x1e);
              if (uVar15 < 0x10) {
                uVar6 = 1;
              }
            }
            else if (uVar15 < 0x10008) {
              uVar15 = uVar14 - 1;
              uVar6 = 0x3f;
              if (uVar15 != 0) {
                for (; uVar15 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              uVar6 = ((ulong)((uint)(uVar15 >> (0x3dU - (char)(uVar6 ^ 0x3f) & 0x3f)) & 3) +
                       ((uVar6 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
            }
            else {
              uVar6 = 0x49;
            }
          } while ((uVar13 == uVar6) &&
                  (bVar3 = (mi_page_queue_t *)(lVar1 + 0x500U) < pmVar7, pmVar7 = pmVar7 + -1, bVar3
                  ));
          uVar13 = uVar14 + 1;
          if (uVar11 <= uVar14) {
            uVar13 = uVar11;
          }
        }
        if (uVar13 <= uVar11) {
          lVar10 = uVar11 - uVar13;
          auVar17._8_4_ = (int)lVar10;
          auVar17._0_8_ = lVar10;
          auVar17._12_4_ = (int)((ulong)lVar10 >> 0x20);
          lVar1 = lVar1 + uVar13 * 8;
          uVar13 = 0;
          auVar17 = auVar17 ^ _DAT_00500510;
          do {
            auVar19._8_4_ = (int)uVar13;
            auVar19._0_8_ = uVar13;
            auVar19._12_4_ = (int)(uVar13 >> 0x20);
            auVar16 = (auVar19 | auVar5) ^ auVar4;
            if ((bool)(~(auVar16._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar16._0_4_ ||
                        auVar17._4_4_ < auVar16._4_4_) & 1)) {
              *(mi_page_t **)(lVar1 + 0xf8 + uVar13 * 8) = pmVar8;
            }
            if ((auVar16._12_4_ != auVar17._12_4_ || auVar16._8_4_ <= auVar17._8_4_) &&
                auVar16._12_4_ <= auVar17._12_4_) {
              *(mi_page_t **)(lVar1 + 0x100 + uVar13 * 8) = pmVar8;
            }
            uVar13 = uVar13 + 2;
          } while ((lVar10 + 2U & 0xfffffffffffffffe) != uVar13);
        }
      }
    }
  }
  else {
    pmVar8->next = (mi_page_s *)CONCAT71(in_register_00000011,enqueue_at_end);
    to->last = (mi_page_t *)CONCAT71(in_register_00000011,enqueue_at_end);
  }
  *(byte *)(CONCAT71(in_register_00000011,enqueue_at_end) + 0xe) =
       *(byte *)(CONCAT71(in_register_00000011,enqueue_at_end) + 0xe) & 0xfe |
       to->block_size == 0x10010;
  return;
}

Assistant:

static void mi_page_queue_enqueue_from_ex(mi_page_queue_t* to, mi_page_queue_t* from, bool enqueue_at_end, mi_page_t* page) {
  mi_assert_internal(page != NULL);
  mi_assert_expensive(mi_page_queue_contains(from, page));
  mi_assert_expensive(!mi_page_queue_contains(to, page));
  const size_t bsize = mi_page_block_size(page);
  MI_UNUSED(bsize);
  mi_assert_internal((bsize == to->block_size && bsize == from->block_size) ||
                     (bsize == to->block_size && mi_page_queue_is_full(from)) ||
                     (bsize == from->block_size && mi_page_queue_is_full(to)) ||
                     (mi_page_is_large_or_huge(page) && mi_page_queue_is_huge(to)) ||
                     (mi_page_is_large_or_huge(page) && mi_page_queue_is_full(to)));

  mi_heap_t* heap = mi_page_heap(page);

  // delete from `from`
  if (page->prev != NULL) page->prev->next = page->next;
  if (page->next != NULL) page->next->prev = page->prev;
  if (page == from->last)  from->last = page->prev;
  if (page == from->first) {
    from->first = page->next;
    // update first
    mi_assert_internal(mi_heap_contains_queue(heap, from));
    mi_heap_queue_first_update(heap, from);
  }

  // insert into `to`
  if (enqueue_at_end) {
    // enqueue at the end
    page->prev = to->last;
    page->next = NULL;
    if (to->last != NULL) {
      mi_assert_internal(heap == mi_page_heap(to->last));
      to->last->next = page;
      to->last = page;
    }
    else {
      to->first = page;
      to->last = page;
      mi_heap_queue_first_update(heap, to);
    }
  }
  else {
    if (to->first != NULL) {
      // enqueue at 2nd place
      mi_assert_internal(heap == mi_page_heap(to->first));
      mi_page_t* next = to->first->next;
      page->prev = to->first;
      page->next = next;
      to->first->next = page;
      if (next != NULL) {
        next->prev = page;
      }
      else {
        to->last = page;
      }
    }
    else {
      // enqueue at the head (singleton list)
      page->prev = NULL;
      page->next = NULL;
      to->first = page;
      to->last = page;
      mi_heap_queue_first_update(heap, to);
    }
  }

  mi_page_set_in_full(page, mi_page_queue_is_full(to));
}